

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void CVmRun::get_local_from_frame
               (vm_val_t *val,vm_val_t *fp,int varnum,int is_param,int is_ctx_local,int ctx_arr_idx)

{
  vm_val_t *pvVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  int in_R8D;
  int32_t in_R9D;
  vm_val_t idxval;
  vm_val_t *cl;
  int in_stack_ffffffffffffffcc;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  
  if (in_ECX == 0) {
    if (in_R8D == 0) {
      pvVar1 = get_local_from_frame
                         ((vm_val_t *)in_stack_ffffffffffffffd0.native_desc,
                          in_stack_ffffffffffffffcc);
      *in_RDI = *(undefined8 *)pvVar1;
      *(anon_union_8_8_cb74652f_for_val *)(in_RDI + 1) = pvVar1->val;
    }
    else {
      pvVar1 = get_local_from_frame
                         ((vm_val_t *)in_stack_ffffffffffffffd0.native_desc,
                          in_stack_ffffffffffffffcc);
      vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffc8,in_R9D);
      apply_index((vm_val_t *)CONCAT44(in_EDX,in_ECX),(vm_val_t *)CONCAT44(in_R8D,in_R9D),pvVar1);
    }
  }
  else {
    pvVar1 = get_param_from_frame
                       ((vm_val_t *)in_stack_ffffffffffffffd0.native_desc,in_stack_ffffffffffffffcc)
    ;
    *in_RDI = *(undefined8 *)pvVar1;
    *(anon_union_8_8_cb74652f_for_val *)(in_RDI + 1) = pvVar1->val;
  }
  return;
}

Assistant:

void CVmRun::get_local_from_frame(VMG_ vm_val_t *val, vm_val_t *fp,
                                  int varnum, int is_param,
                                  int is_ctx_local, int ctx_arr_idx)
{
    /* check which kind of variable we have */
    if (is_param)
    {
        /* parameter - get it from the frame */
        *val = *get_param_from_frame(vmg_ fp, varnum);
    }
    else if (is_ctx_local)
    {
        /* context local - get the context local */
        vm_val_t *cl = get_local_from_frame(vmg_ fp, varnum);

        /* index it to get the local */
        vm_val_t idxval;
        idxval.set_int(ctx_arr_idx);
        apply_index(vmg_ val, cl, &idxval);
    }
    else
    {
        /* regular local - get it from the frame */
        *val = *get_local_from_frame(vmg_ fp, varnum);
    }
}